

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void aom_highbd_upsampled_pred_c
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,int ref_stride,
               int bd,int subpel_search)

{
  ushort uVar1;
  InterpFilterParams *pIVar2;
  InterpFilterParams *pIVar3;
  void *__dest;
  long *plVar4;
  scale_factors *psVar5;
  ptrdiff_t src_stride;
  int16_t *filter_y;
  short sVar6;
  uint uVar7;
  void *__src;
  bool bVar8;
  bool bVar9;
  undefined1 auStackY_a138 [184];
  undefined8 uStackY_a080;
  uint16_t temp [20480];
  
  if (xd != (MACROBLOCKD *)0x0) {
    uVar1 = *(ushort *)&(*xd->mi)->field_0xa7 >> 7;
    uVar7 = uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      psVar5 = xd->block_ref_scale_factors[0];
    }
    else {
      psVar5 = &cm->sf_identity;
    }
    if ((psVar5->x_scale_fp == -1) || (psVar5->y_scale_fp == -1)) {
      bVar8 = false;
    }
    else {
      bVar8 = psVar5->y_scale_fp != 0x4000 || psVar5->x_scale_fp != 0x4000;
    }
    if (bVar8) {
      sVar6 = (short)uVar7;
      bVar9 = sVar6 == 0;
      temp._176_4_ = xd->bd;
      temp._68_4_ = 3;
      if (10 < (int)temp._176_4_) {
        temp._68_4_ = temp._176_4_ + -7;
      }
      temp._72_4_ = 0xb;
      if (10 < (int)temp._176_4_) {
        temp._72_4_ = 0x15 - temp._176_4_;
      }
      temp[0x18] = 0;
      temp[0x19] = 0;
      temp[0x1c] = 0;
      temp[0x1d] = 0;
      temp[0x1e] = 0;
      temp[0x1f] = 0;
      temp[0x20] = 0;
      temp[0x21] = 0;
      temp[0x26] = 0;
      temp[0x27] = 0;
      temp[0x28] = 0;
      temp[0x29] = 0;
      temp[0x2a] = 0;
      temp[0x2b] = 0;
      temp._160_4_ = xd->plane[0].subsampling_x;
      temp._164_4_ = xd->plane[0].subsampling_y;
      temp._120_4_ = (mi_row << 2) >> ((byte)temp._164_4_ & 0x1f);
      temp._124_4_ = (mi_col << 2) >> ((byte)temp._160_4_ & 0x1f);
      temp._208_4_ = (0x120U >> ((byte)temp._164_4_ & 0x1f)) * -0x400 + 0x1000;
      temp._212_4_ = (0x120U >> ((byte)temp._160_4_ & 0x1f)) * -0x400 + 0x1000;
      temp._112_4_ = width;
      temp._116_4_ = height;
      temp._180_4_ = (uint)xd->cur_buf->flags >> 3 & 1;
      temp[0] = 0;
      temp[1] = 0;
      temp[2] = 0;
      temp[3] = 0;
      if (sVar6 == 0) {
        pIVar2 = av1_interp_filter_params_list;
        pIVar3 = av1_interp_filter_params_list;
        if (width < 5) {
          pIVar3 = av1_interp_4tap;
        }
        temp._96_8_ = pIVar3;
        if (height < 5) {
          pIVar2 = av1_interp_4tap;
        }
      }
      else {
        pIVar2 = &av1_intrabc_filter_params;
        temp._96_8_ = &av1_intrabc_filter_params;
      }
      temp._128_8_ = xd->plane[0].pre[(ulong)bVar9 - 1].buf;
      temp._136_8_ = xd->plane[0].pre[(ulong)bVar9 - 1].buf0;
      temp._144_8_ = *(undefined8 *)&xd->plane[0].pre[(ulong)bVar9 - 1].width;
      temp._152_8_ = *(undefined8 *)&xd->plane[0].pre[(ulong)bVar9 - 1].stride;
      temp._104_8_ = pIVar2;
      temp._168_8_ = psVar5;
      temp._204_4_ = uVar7;
      build_one_inter_predictor(comp_pred8,width,mv,(InterPredParams *)temp);
      if (bVar8) {
        return;
      }
    }
  }
  if (subpel_search - 1U < 3) {
    plVar4 = *(long **)(&DAT_005dc880 + (ulong)(subpel_search - 1U) * 8);
  }
  else {
    plVar4 = (long *)0x0;
  }
  if (subpel_y_q3 == 0 && subpel_x_q3 == 0) {
    if (0 < height) {
      __dest = (void *)((long)comp_pred8 * 2);
      __src = (void *)((long)ref8 * 2);
      do {
        memcpy(__dest,__src,(long)width * 2);
        __src = (void *)((long)__src + (long)ref_stride * 2);
        __dest = (void *)((long)__dest + (long)width * 2);
        height = height + -1;
      } while (height != 0);
    }
  }
  else if (subpel_y_q3 == 0) {
    uStackY_a080 = 0x22d4d5;
    aom_highbd_convolve8_horiz_c
              (ref8,(long)ref_stride,comp_pred8,(long)width,
               (int16_t *)((long)(subpel_x_q3 * 2) * (ulong)*(ushort *)(plVar4 + 1) * 2 + *plVar4),
               0x10,(int16_t *)0x0,-1,width,height,bd);
  }
  else {
    if (subpel_x_q3 == 0) {
      filter_y = (int16_t *)((long)(subpel_y_q3 * 2) * (ulong)*(ushort *)(plVar4 + 1) * 2 + *plVar4)
      ;
      src_stride = (ptrdiff_t)ref_stride;
    }
    else {
      uVar1 = *(ushort *)(plVar4 + 1);
      filter_y = (int16_t *)(*plVar4 + (long)(subpel_y_q3 * 2) * (ulong)uVar1 * 2);
      uStackY_a080 = 0x22d421;
      aom_highbd_convolve8_horiz_c
                (ref8 + -(long)(int)(((uVar1 >> 1) - 1) * ref_stride),(long)ref_stride,
                 (uint8_t *)((ulong)temp >> 1),0x80,
                 (int16_t *)(*plVar4 + (long)(subpel_x_q3 * 2) * (ulong)uVar1 * 2),0x10,
                 (int16_t *)0x0,-1,width,(subpel_y_q3 + height * 8 + -8 >> 3) + (uint)uVar1,bd);
      ref8 = (uint8_t *)((ulong)(auStackY_a138 + ((*(ushort *)(plVar4 + 1) & 0xfffe) << 7)) >> 1);
      src_stride = 0x80;
    }
    uStackY_a080 = 0x22d513;
    aom_highbd_convolve8_vert_c
              (ref8,src_stride,comp_pred8,(long)width,(int16_t *)0x0,-1,filter_y,0x10,width,height,
               bd);
  }
  return;
}

Assistant:

void aom_highbd_upsampled_pred_c(MACROBLOCKD *xd,
                                 const struct AV1Common *const cm, int mi_row,
                                 int mi_col, const MV *const mv,
                                 uint8_t *comp_pred8, int width, int height,
                                 int subpel_x_q3, int subpel_y_q3,
                                 const uint8_t *ref8, int ref_stride, int bd,
                                 int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred8, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);

  if (!subpel_x_q3 && !subpel_y_q3) {
    const uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
    uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
    for (int i = 0; i < height; i++) {
      memcpy(comp_pred, ref, width * sizeof(*comp_pred));
      comp_pred += width;
      ref += ref_stride;
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_highbd_convolve8_horiz_c(ref8, ref_stride, comp_pred8, width, kernel,
                                 16, NULL, -1, width, height, bd);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_highbd_convolve8_vert_c(ref8, ref_stride, comp_pred8, width, NULL, -1,
                                kernel, 16, width, height, bd);
  } else {
    DECLARE_ALIGNED(16, uint16_t,
                    temp[((MAX_SB_SIZE + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter->taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_highbd_convolve8_horiz_c(ref8 - ref_stride * ((filter->taps >> 1) - 1),
                                 ref_stride, CONVERT_TO_BYTEPTR(temp),
                                 MAX_SB_SIZE, kernel_x, 16, NULL, -1, width,
                                 intermediate_height, bd);
    aom_highbd_convolve8_vert_c(
        CONVERT_TO_BYTEPTR(temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1)),
        MAX_SB_SIZE, comp_pred8, width, NULL, -1, kernel_y, 16, width, height,
        bd);
  }
}